

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

void output_comment_bytes(Context_conflict *ctx,uint8 *buf,size_t len)

{
  int iVar1;
  uint32 local_28;
  int local_24;
  anon_union_4_2_62d8b094 overflow;
  uint32 tokencount;
  size_t len_local;
  uint8 *buf_local;
  Context_conflict *ctx_local;
  
  _overflow = len;
  len_local = (size_t)buf;
  buf_local = (uint8 *)ctx;
  if (len < 0x3fffd) {
    iVar1 = isfail(ctx);
    if (iVar1 == 0) {
      local_24 = (int)(_overflow >> 2) + (uint)((_overflow & 3) != 0);
      output_token((Context_conflict *)buf_local,local_24 * 0x10000 | 0xfffe);
      for (; 3 < _overflow; _overflow = _overflow - 4) {
        output_token_noswap((Context_conflict *)buf_local,*(uint32 *)len_local);
        len_local = len_local + 4;
      }
      if (_overflow != 0) {
        local_28 = 0;
        memcpy(&local_28,(void *)len_local,_overflow);
        output_token_noswap((Context_conflict *)buf_local,local_28);
      }
    }
  }
  else {
    fail(ctx,"Comment field is too big");
  }
  return;
}

Assistant:

static void output_comment_bytes(Context *ctx, const uint8 *buf, size_t len)
{
    if (len > (0xFFFF * 4))  // length is stored as token count, in 16 bits.
        fail(ctx, "Comment field is too big");
    else if (!isfail(ctx))
    {
        const uint32 tokencount = (len / 4) + ((len % 4) ? 1 : 0);
        output_token(ctx, 0xFFFE | (tokencount << 16));
        while (len >= 4)
        {
            output_token_noswap(ctx, *((const uint32 *) buf));
            len -= 4;
            buf += 4;
        } // while

        if (len > 0)  // handle spillover...
        {
            union { uint8 ui8[4]; uint32 ui32; } overflow;
            overflow.ui32 = 0;
            memcpy(overflow.ui8, buf, len);
            output_token_noswap(ctx, overflow.ui32);
        } // if
    } // else if
}